

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.h
# Opt level: O3

bool __thiscall Kumu::ByteString::Unarchive(ByteString *this,MemIOReader *Reader)

{
  uint uVar1;
  uint uVar2;
  Result_t local_90;
  
  if (Reader == (MemIOReader *)0x0) {
    __assert_fail("Reader",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.h"
                  ,0x23d,"virtual bool Kumu::ByteString::Unarchive(MemIOReader *)");
  }
  uVar1 = Reader->m_size;
  if ((ulong)uVar1 + 4 <= (ulong)Reader->m_capacity) {
    uVar2 = *(uint *)(Reader->m_p + uVar1);
    uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    Reader->m_size = uVar1 + 4;
    Capacity(&local_90,this,uVar2);
    Result_t::~Result_t(&local_90);
    if ((-1 < local_90.value) && (Reader->m_size + uVar2 <= Reader->m_capacity)) {
      memcpy(this->m_Data,Reader->m_p + Reader->m_size,(ulong)uVar2);
      Reader->m_size = Reader->m_size + uVar2;
      this->m_Length = uVar2;
      return true;
    }
  }
  return false;
}

Assistant:

inline virtual bool Unarchive(MemIOReader* Reader) {
	assert(Reader);
	ui32_t tmp_len;
	if ( ! Reader->ReadUi32BE(&tmp_len) ) return false;
	if ( KM_FAILURE(Capacity(tmp_len)) ) return false;
	if ( ! Reader->ReadRaw(m_Data, tmp_len) ) return false;
	m_Length = tmp_len;
	return true;
      }